

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool list_sorted(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  char *pcVar2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 obj;
  uint32_t n;
  gravity_value_t *array;
  gravity_value_t gVar3;
  gravity_object_t *predicate;
  code *callback;
  
  if ((nargs < 2) || (args[1].isa != gravity_class_closure)) {
    predicate = (gravity_object_t *)0x0;
  }
  else {
    predicate = args[1].field_1.p;
  }
  pgVar1 = (args->field_1).p;
  gVar3 = *args;
  n = (uint32_t)pgVar1->objclass;
  obj.p = (gravity_object_t *)gravity_list_new((gravity_vm *)0x0,n);
  memcpy(*(void **)&(obj.p)->has_outer,*(void **)&pgVar1->has_outer,(long)(int)n << 4);
  pcVar2 = pgVar1->identifier;
  (obj.p)->objclass = pgVar1->objclass;
  (obj.p)->identifier = pcVar2;
  if (1 < (int)n) {
    if (predicate == (gravity_object_t *)0x0) {
      callback = list_default_string_compare;
      if ((gravity_class_t *)**(long **)&pgVar1->has_outer == gravity_class_float) {
        callback = list_default_number_compare;
      }
      if ((gravity_class_t *)**(long **)&pgVar1->has_outer == gravity_class_int) {
        callback = list_default_number_compare;
      }
      array = *(gravity_value_t **)&(obj.p)->has_outer;
      predicate = (gravity_object_t *)0x0;
    }
    else {
      array = *(gravity_value_t **)&(obj.p)->has_outer;
      callback = (list_comparison_callback *)0x0;
    }
    quicksort(vm,array,0,n - 1,gVar3,(gravity_closure_t *)predicate,callback);
  }
  gravity_vm_transfer(vm,obj.p);
  gVar3.field_1.p = (gravity_object_t *)obj.n;
  gVar3.isa = (obj.p)->isa;
  gravity_vm_setslot(vm,gVar3,rindex);
  return true;
}

Assistant:

static bool list_sorted (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    //the predicate is the comparison function passed to list.sort() if any
    gravity_closure_t *predicate = NULL;
    list_comparison_callback *callback = NULL;
    if (nargs >=2 && VALUE_ISA_CLOSURE(GET_VALUE(1))) predicate = VALUE_AS_CLOSURE(GET_VALUE(1));
    
    gravity_value_t selfvalue = GET_VALUE(0); // self parameter
    gravity_list_t *list = VALUE_AS_LIST(selfvalue);
    
    int32_t count = (int32_t)marray_size(list->array);
    
    // do not transfer newlist to GC because it could be freed during predicate closure execution
    // (because newlist is not yet in any stack)
    gravity_list_t *newlist = gravity_list_new(NULL, (uint32_t)count);

    //memcpy should be faster than pushing element by element
    memcpy(newlist->array.p, list->array.p, sizeof(gravity_value_t)*count);
    newlist->array.m = list->array.m;
    newlist->array.n = list->array.n;
    if (count > 1) {
        if (predicate == NULL) {
            gravity_value_t first_value = marray_get(list->array, 0);
            if (VALUE_ISA_INT(first_value) || (VALUE_ISA_FLOAT(first_value))) callback = list_default_number_compare;
            else callback = list_default_string_compare;
        }
        quicksort(vm, newlist->array.p, 0, (int32_t)count-1, selfvalue, predicate, callback);
    }

    gravity_vm_transfer(vm, (gravity_object_t*) newlist);
    RETURN_VALUE(VALUE_FROM_OBJECT(newlist), rindex);
}